

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O2

int __thiscall SightCheck::P_SightBlockLinesIterator(SightCheck *this,int x,int y)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  FPolyObj *pFVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  int *piVar9;
  polyblock_t *ppVar10;
  
  iVar3 = bmapwidth * y + x;
  bVar5 = 1;
  if (this->portalfound == false) {
    bVar5 = PortalBlockmap.data.Array[y * PortalBlockmap.dx + x].containsLinkedPortals;
  }
  ppVar10 = PolyBlockMap[iVar3];
  bVar6 = PortalBlockmap.hasLinkedPolyPortals;
  if (ppVar10 == (polyblock_t *)0x0) {
    bVar6 = 0;
  }
  this->portalfound = (bool)(bVar6 | bVar5);
  iVar7 = 1;
  do {
    if (ppVar10 == (polyblock_t *)0x0) {
      piVar9 = blockmaplump + blockmap[iVar3];
      do {
        piVar1 = piVar9 + 1;
        if ((long)*piVar1 == -1) {
          return iVar7;
        }
        piVar9 = piVar9 + 1;
        bVar2 = P_SightCheckLine(this,lines + *piVar1);
      } while ((bVar2) || (iVar7 = -1, this->portalfound != false));
      return 0;
    }
    pFVar4 = ppVar10->polyobj;
    if ((pFVar4 != (FPolyObj *)0x0) && (pFVar4->validcount != validcount)) {
      pFVar4->validcount = validcount;
      for (uVar8 = 0; uVar8 < (pFVar4->Linedefs).Count; uVar8 = uVar8 + 1) {
        bVar2 = P_SightCheckLine(this,(pFVar4->Linedefs).Array[uVar8]);
        if ((!bVar2) && (iVar7 = -1, this->portalfound != true)) {
          return 0;
        }
        pFVar4 = ppVar10->polyobj;
      }
    }
    ppVar10 = ppVar10->next;
  } while( true );
}

Assistant:

int SightCheck::P_SightBlockLinesIterator (int x, int y)
{
	int offset;
	int *list;
	int res = 1;

	polyblock_t *polyLink;
	unsigned int i;
	extern polyblock_t **PolyBlockMap;

	offset = y*bmapwidth+x;

	// if any of the previous blocks may contain a portal we may abort the collection of lines here, but we may not abort the sight check.
	// (We still try to delay activating this for as long as possible.)
	portalfound = portalfound || PortalBlockmap(x, y).containsLinkedPortals;

	polyLink = PolyBlockMap[offset];
	portalfound |= (polyLink && PortalBlockmap.hasLinkedPolyPortals);
	while (polyLink)
	{
		if (polyLink->polyobj)
		{ // only check non-empty links
			if (polyLink->polyobj->validcount != validcount)
			{
				polyLink->polyobj->validcount = validcount;
				for (i = 0; i < polyLink->polyobj->Linedefs.Size(); i++)
				{
					if (!P_SightCheckLine(polyLink->polyobj->Linedefs[i]))
					{
						if (!portalfound) return 0;
						else res = -1;
					}
				}
			}
		}
		polyLink = polyLink->next;
	}

	offset = *(blockmap + offset);

	for (list = blockmaplump + offset + 1; *list != -1; list++)
	{
		if (!P_SightCheckLine (&lines[*list]))
		{
			if (!portalfound) return 0;
			else res = -1;
		}
	}

	return res;			// everything was checked
}